

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void phosg::print_data(FILE *stream,vector<iovec,_std::allocator<iovec>_> *iovs,
                      uint64_t start_address,vector<iovec,_std::allocator<iovec>_> *prev_iovs,
                      uint64_t flags)

{
  iovec *prev_iovs_00;
  size_t num_prev_iovs;
  
  if (prev_iovs == (vector<iovec,_std::allocator<iovec>_> *)0x0) {
    prev_iovs_00 = (iovec *)0x0;
    num_prev_iovs = 0;
  }
  else {
    prev_iovs_00 = *(iovec **)prev_iovs;
    num_prev_iovs = *(long *)(prev_iovs + 8) - (long)prev_iovs_00 >> 4;
  }
  print_data(stream,*(iovec **)iovs,*(long *)(iovs + 8) - (long)*(iovec **)iovs >> 4,start_address,
             prev_iovs_00,num_prev_iovs,flags);
  return;
}

Assistant:

void print_data(
    FILE* stream,
    const vector<struct iovec>& iovs,
    uint64_t start_address,
    const vector<struct iovec>* prev_iovs,
    uint64_t flags) {
  if (prev_iovs) {
    print_data(stream, iovs.data(), iovs.size(), start_address,
        prev_iovs->data(), prev_iovs->size(), flags);
  } else {
    print_data(stream, iovs.data(), iovs.size(), start_address, nullptr, 0,
        flags);
  }
}